

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsidebar_p.cpp
# Opt level: O0

int __thiscall QSidebar::qt_metacall(QSidebar *this,Call _c,int _id,void **_a)

{
  int _id_00;
  void **in_RCX;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  void **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  Call in_stack_ffffffffffffffc4;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _id_00 = QListView::qt_metacall
                     ((QListView *)in_RDI,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
  if (-1 < _id_00) {
    if (in_ESI == 0) {
      if (_id_00 < 4) {
        qt_static_metacall(in_RDI,InvokeMetaMethod,_id_00,in_RCX);
      }
      _id_00 = _id_00 + -4;
    }
    if (in_ESI == 7) {
      if (_id_00 < 4) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      _id_00 = _id_00 + -4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return _id_00;
}

Assistant:

int QSidebar::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QListView::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
    return _id;
}